

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint32 uVar4;
  bool bVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  char *pcVar10;
  
  if (this->unknown_ != (string *)0x0) {
    uVar8 = (ulong)(num * 8 + 3);
    cVar9 = (char)this->unknown_;
    if (0x7f < num * 8) {
      do {
        std::__cxx11::string::push_back(cVar9);
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar5);
    }
    std::__cxx11::string::push_back(cVar9);
  }
  uVar7 = num << 3;
  iVar3 = ctx->depth_;
  ctx->depth_ = iVar3 + -1;
  if (iVar3 < 1) {
    pcVar10 = (char *)0x0;
  }
  else {
    ctx->group_depth_ = ctx->group_depth_ + 1;
    pcVar6 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar10 = (char *)0x0;
    if (uVar4 == (uVar7 | 3)) {
      pcVar10 = pcVar6;
    }
  }
  if (pcVar10 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else if (this->unknown_ != (string *)0x0) {
    uVar8 = (ulong)(uVar7 | 4);
    cVar9 = (char)this->unknown_;
    if (0x7f < uVar7) {
      do {
        std::__cxx11::string::push_back(cVar9);
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar5);
    }
    std::__cxx11::string::push_back(cVar9);
  }
  return pcVar10;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }